

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

int Abc_TtVarsAreSymmetric(word *pTruth,int nVars,int i,int j,word *pCof0,word *pCof1)

{
  word wVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  word *pwVar7;
  uint uVar8;
  int iVar9;
  word *pwVar10;
  word *pwVar11;
  ulong uVar12;
  
  bVar3 = (byte)j;
  uVar8 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar8 = 1;
  }
  if ((nVars <= i) || (nVars <= j)) {
    __assert_fail("i < nVars && j < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0xc3a,"int Abc_TtVarsAreSymmetric(word *, int, int, int, word *, word *)");
  }
  bVar2 = (byte)i;
  if (uVar8 == 1) {
    bVar2 = (byte)(1 << (bVar2 & 0x1f));
    *pCof0 = (s_Truths6Neg[i] & *pTruth) << (bVar2 & 0x3f) | s_Truths6Neg[i] & *pTruth;
    *pCof1 = (s_Truths6[i] & *pTruth) >> (bVar2 & 0x3f) | s_Truths6[i] & *pTruth;
    bVar3 = (byte)(1 << (bVar3 & 0x1f));
    *pCof0 = (s_Truths6[j] & *pCof0) >> (bVar3 & 0x3f) | s_Truths6[j] & *pCof0;
    *pCof1 = (s_Truths6Neg[j] & *pCof1) << (bVar3 & 0x3f) | s_Truths6Neg[j] & *pCof1;
    goto LAB_004f09f8;
  }
  if (i < 6) {
    if (0 < (int)uVar8) {
      uVar5 = s_Truths6Neg[i];
      uVar12 = 0;
      do {
        pCof0[uVar12] =
             (pTruth[uVar12] & uVar5) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
             pTruth[uVar12] & uVar5;
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
LAB_004f0adb:
      if (i < 6) {
        if (0 < (int)uVar8) {
          uVar5 = s_Truths6[i];
          uVar12 = 0;
          do {
            pCof1[uVar12] =
                 (pTruth[uVar12] & uVar5) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                 pTruth[uVar12] & uVar5;
            uVar12 = uVar12 + 1;
          } while (uVar8 != uVar12);
        }
      }
      else if (0 < (int)uVar8) {
        pwVar7 = pTruth + (int)uVar8;
        bVar2 = (byte)(i + -6);
        uVar6 = 1 << (bVar2 & 0x1f);
        iVar9 = 2 << (bVar2 & 0x1f);
        uVar5 = 1;
        if (1 < (int)uVar6) {
          uVar5 = (ulong)uVar6;
        }
        pwVar10 = pCof1;
        do {
          if (i + -6 != 0x1f) {
            uVar12 = 0;
            do {
              wVar1 = pTruth[(long)(int)uVar6 + uVar12];
              pwVar10[uVar12] = wVar1;
              pwVar10[(long)(int)uVar6 + uVar12] = wVar1;
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
          }
          pTruth = pTruth + iVar9;
          pwVar10 = pwVar10 + iVar9;
        } while (pTruth < pwVar7);
      }
    }
  }
  else if (0 < (int)uVar8) {
    bVar4 = (byte)(i + -6);
    uVar6 = 1 << (bVar4 & 0x1f);
    iVar9 = 2 << (bVar4 & 0x1f);
    uVar5 = 1;
    if (1 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    pwVar7 = pCof0 + (int)uVar6;
    pwVar10 = pTruth;
    pwVar11 = pCof0;
    do {
      if (i + -6 != 0x1f) {
        uVar12 = 0;
        do {
          wVar1 = pwVar10[uVar12];
          pwVar11[uVar12] = wVar1;
          pwVar7[uVar12] = wVar1;
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
      }
      pwVar10 = pwVar10 + iVar9;
      pwVar7 = pwVar7 + iVar9;
      pwVar11 = pwVar11 + iVar9;
    } while (pwVar10 < pTruth + (int)uVar8);
    goto LAB_004f0adb;
  }
  if (j < 6) {
    if ((int)uVar8 < 1) {
      return 1;
    }
    uVar5 = s_Truths6[j];
    uVar12 = 0;
    do {
      pCof0[uVar12] =
           (pCof0[uVar12] & uVar5) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) | pCof0[uVar12] & uVar5;
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
  }
  else {
    if ((int)uVar8 < 1) {
      return 1;
    }
    bVar2 = (byte)(j + -6);
    uVar6 = 1 << (bVar2 & 0x1f);
    uVar5 = 1;
    if (1 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    pwVar7 = pCof0;
    do {
      if (j + -6 != 0x1f) {
        uVar12 = 0;
        do {
          pwVar7[uVar12] = pwVar7[(long)(int)uVar6 + uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
      }
      pwVar7 = pwVar7 + (2 << (bVar2 & 0x1f));
    } while (pwVar7 < pCof0 + (int)uVar8);
  }
  if (j < 6) {
    if ((int)uVar8 < 1) {
      return 1;
    }
    uVar5 = s_Truths6Neg[j];
    uVar12 = 0;
    do {
      pCof1[uVar12] =
           (pCof1[uVar12] & uVar5) << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) | pCof1[uVar12] & uVar5;
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
  }
  else {
    if ((int)uVar8 < 1) {
      return 1;
    }
    bVar3 = (byte)(j + -6);
    uVar6 = 1 << (bVar3 & 0x1f);
    iVar9 = 2 << (bVar3 & 0x1f);
    uVar5 = 1;
    if (1 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    pwVar7 = pCof1 + (int)uVar6;
    pwVar10 = pCof1;
    do {
      if (j + -6 != 0x1f) {
        uVar12 = 0;
        do {
          pwVar7[uVar12] = pwVar10[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
      }
      pwVar10 = pwVar10 + iVar9;
      pwVar7 = pwVar7 + iVar9;
    } while (pwVar10 < pCof1 + (int)uVar8);
  }
  if ((int)uVar8 < 1) {
    return 1;
  }
LAB_004f09f8:
  uVar5 = 0;
  do {
    if (pCof0[uVar5] != pCof1[uVar5]) {
      return 0;
    }
    uVar5 = uVar5 + 1;
  } while (uVar8 != uVar5);
  return 1;
}

Assistant:

static inline int Abc_TtVarsAreSymmetric( word * pTruth, int nVars, int i, int j, word * pCof0, word * pCof1 )
{
    int nWords = Abc_TtWordNum( nVars );
    assert( i < nVars && j < nVars );
    Abc_TtCofactor0p( pCof0, pTruth, nWords, i );
    Abc_TtCofactor1p( pCof1, pTruth, nWords, i );
    Abc_TtCofactor1( pCof0, nWords, j );
    Abc_TtCofactor0( pCof1, nWords, j );
    return Abc_TtEqual( pCof0, pCof1, nWords );
}